

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

void __thiscall FIX::DataDictionary::checkValidFormat(DataDictionary *this,FieldBase *field)

{
  int field_00;
  string *psVar1;
  FieldConvertError *anon_var_0;
  UtcDate local_60;
  UtcTimeStamp local_48;
  Type local_1c;
  FieldBase *pFStack_18;
  Type type;
  FieldBase *field_local;
  DataDictionary *this_local;
  
  local_1c = Unknown;
  pFStack_18 = field;
  field_local = (FieldBase *)this;
  field_00 = FieldBase::getTag(field);
  getFieldType(this,field_00,&local_1c);
  switch(local_1c) {
  case Unknown:
    break;
  case String:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    EmptyConvertor::convert(psVar1);
    break;
  case Char:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    CharConvertor::convert(psVar1);
    break;
  case Price:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    DoubleConvertor::convert(psVar1);
    break;
  case Int:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    IntTConvertor<int>::convert(psVar1);
    break;
  case Amt:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    DoubleConvertor::convert(psVar1);
    break;
  case Qty:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    DoubleConvertor::convert(psVar1);
    break;
  case Currency:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    EmptyConvertor::convert(psVar1);
    break;
  case MultipleValueString:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    EmptyConvertor::convert(psVar1);
    break;
  case MultipleStringValue:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    EmptyConvertor::convert(psVar1);
    break;
  case MultipleCharValue:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    EmptyConvertor::convert(psVar1);
    break;
  case Exchange:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    EmptyConvertor::convert(psVar1);
    break;
  case UtcTimeStamp:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    UtcTimeStampConvertor::convert(&local_48,psVar1);
    UtcTimeStamp::~UtcTimeStamp(&local_48);
    break;
  case Boolean:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    BoolConvertor::convert(psVar1);
    break;
  case LocalMktTime:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    EmptyConvertor::convert(psVar1);
    break;
  case LocalMktDate:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    EmptyConvertor::convert(psVar1);
    break;
  case Data:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    EmptyConvertor::convert(psVar1);
    break;
  case Float:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    DoubleConvertor::convert(psVar1);
    break;
  case PriceOffset:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    DoubleConvertor::convert(psVar1);
    break;
  case MonthYear:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    EmptyConvertor::convert(psVar1);
    break;
  case DayOfMonth:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    EmptyConvertor::convert(psVar1);
    break;
  case UtcDate:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    UtcDateConvertor::convert(&local_60,psVar1);
    UtcDate::~UtcDate(&local_60);
    break;
  case UtcTimeOnly:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    UtcTimeOnlyConvertor::convert((UtcTimeOnly *)&anon_var_0,psVar1);
    UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&anon_var_0);
    break;
  case NumInGroup:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    IntTConvertor<int>::convert(psVar1);
    break;
  case Percentage:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    DoubleConvertor::convert(psVar1);
    break;
  case SeqNum:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    IntTConvertor<unsigned_long>::convert(psVar1);
    break;
  case TagNum:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    IntTConvertor<int>::convert(psVar1);
    break;
  case Length:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    IntTConvertor<int>::convert(psVar1);
    break;
  case Country:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    EmptyConvertor::convert(psVar1);
    break;
  case TzTimeOnly:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    EmptyConvertor::convert(psVar1);
    break;
  case TzTimeStamp:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    EmptyConvertor::convert(psVar1);
    break;
  case XmlData:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    EmptyConvertor::convert(psVar1);
    break;
  case Language:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    EmptyConvertor::convert(psVar1);
    break;
  case Xid:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    EmptyConvertor::convert(psVar1);
    break;
  case XidRef:
    psVar1 = FieldBase::getString_abi_cxx11_(pFStack_18);
    EmptyConvertor::convert(psVar1);
  }
  return;
}

Assistant:

EXCEPT(IncorrectDataFormat) {
    try {
      TYPE::Type type = TYPE::Unknown;
      getFieldType(field.getTag(), type);
      switch (type) {
      case TYPE::String:
        STRING_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Char:
        CHAR_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Price:
        PRICE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Int:
        INT_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Amt:
        AMT_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Qty:
        QTY_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Currency:
        CURRENCY_CONVERTOR::convert(field.getString());
        break;
      case TYPE::MultipleValueString:
        MULTIPLEVALUESTRING_CONVERTOR::convert(field.getString());
        break;
      case TYPE::MultipleStringValue:
        MULTIPLESTRINGVALUE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::MultipleCharValue:
        MULTIPLECHARVALUE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Exchange:
        EXCHANGE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::UtcTimeStamp:
        UTCTIMESTAMP_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Boolean:
        BOOLEAN_CONVERTOR::convert(field.getString());
        break;
      case TYPE::LocalMktTime:
        LOCALMKTTIME_CONVERTOR::convert(field.getString());
        break;
      case TYPE::LocalMktDate:
        LOCALMKTDATE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Data:
        DATA_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Float:
        FLOAT_CONVERTOR::convert(field.getString());
        break;
      case TYPE::PriceOffset:
        PRICEOFFSET_CONVERTOR::convert(field.getString());
        break;
      case TYPE::MonthYear:
        MONTHYEAR_CONVERTOR::convert(field.getString());
        break;
      case TYPE::DayOfMonth:
        DAYOFMONTH_CONVERTOR::convert(field.getString());
        break;
      case TYPE::UtcDate:
        UTCDATE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::UtcTimeOnly:
        UTCTIMEONLY_CONVERTOR::convert(field.getString());
        break;
      case TYPE::NumInGroup:
        NUMINGROUP_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Percentage:
        PERCENTAGE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::SeqNum:
        SEQNUM_CONVERTOR::convert(field.getString());
        break;
      case TYPE::TagNum:
        TAGNUM_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Length:
        LENGTH_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Country:
        COUNTRY_CONVERTOR::convert(field.getString());
        break;
      case TYPE::TzTimeOnly:
        TZTIMEONLY_CONVERTOR::convert(field.getString());
        break;
      case TYPE::TzTimeStamp:
        TZTIMESTAMP_CONVERTOR::convert(field.getString());
        break;
      case TYPE::XmlData:
        XMLDATA_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Language:
        LANGUAGE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Xid:
        XID_CONVERTOR::convert(field.getString());
        break;
      case TYPE::XidRef:
        XIDREF_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Unknown:
        break;
      }
    } catch (FieldConvertError &) {
      throw IncorrectDataFormat(field.getTag(), field.getString());
    }
  }